

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O3

bool __thiscall ON_Ellipse::Create(ON_Ellipse *this,ON_Circle *c)

{
  bool bVar1;
  bool bVar2;
  ON_Plane *pOVar3;
  long lVar4;
  ON_Ellipse *pOVar5;
  byte bVar6;
  double dVar7;
  double dVar8;
  
  bVar6 = 0;
  pOVar3 = ON_Circle::Plane(c);
  dVar7 = ON_Circle::Radius(c);
  dVar8 = ON_Circle::Radius(c);
  pOVar5 = this;
  for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pOVar5->plane).origin.x = (pOVar3->origin).x;
    pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar6 * -0x10 + 8);
    pOVar5 = (ON_Ellipse *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  this->radius[0] = dVar7;
  this->radius[1] = dVar8;
  bVar1 = ON_Plane::IsValid(&this->plane);
  bVar2 = false;
  if ((bVar1) && (bVar2 = false, 2.3283064365386963e-10 < this->radius[0])) {
    bVar2 = 2.3283064365386963e-10 < this->radius[1];
  }
  return bVar2;
}

Assistant:

bool ON_Ellipse::Create( const ON_Circle& c )
{
  return Create( c.Plane(), c.Radius(), c.Radius() );
}